

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::Chromosome(Chromosome *this)

{
  int iVar1;
  Chromosome *this_local;
  
  this->id = 0;
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::vector(&this->turnList);
  std::
  vector<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>::
  vector(&this->pairs);
  this->collisions = 0;
  this->changed = true;
  std::vector<Coordinate,_std::allocator<Coordinate>_>::vector(&this->pathList);
  iVar1 = idGlobal + 1;
  this->id = idGlobal;
  idGlobal = iVar1;
  return;
}

Assistant:

Chromosome::Chromosome() {
    id = idGlobal++;
}